

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_add(JSON_Object *object,char *name,JSON_Value *value)

{
  char *pcVar1;
  JSON_Status JVar2;
  size_t sVar3;
  JSON_Value *pJVar4;
  size_t sStack_40;
  JSON_Status res;
  size_t cell_ix;
  unsigned_long uStack_30;
  parson_bool_t found;
  unsigned_long hash;
  JSON_Value *value_local;
  char *name_local;
  JSON_Object *object_local;
  
  uStack_30 = 0;
  cell_ix._4_4_ = 0;
  if (((object == (JSON_Object *)0x0) || (name == (char *)0x0)) || (value == (JSON_Value *)0x0)) {
    object_local._4_4_ = -1;
  }
  else {
    hash = (unsigned_long)value;
    value_local = (JSON_Value *)name;
    name_local = (char *)object;
    sVar3 = strlen(name);
    uStack_30 = hash_string(name,sVar3);
    pcVar1 = name_local;
    pJVar4 = value_local;
    cell_ix._4_4_ = 0;
    sVar3 = strlen((char *)value_local);
    sStack_40 = json_object_get_cell_ix
                          ((JSON_Object *)pcVar1,(char *)pJVar4,sVar3,uStack_30,
                           (parson_bool_t *)((long)&cell_ix + 4));
    if (cell_ix._4_4_ == 0) {
      if (*(ulong *)(name_local + 0x38) <= *(ulong *)(name_local + 0x30)) {
        JVar2 = json_object_grow_and_rehash((JSON_Object *)name_local);
        pcVar1 = name_local;
        pJVar4 = value_local;
        if (JVar2 != 0) {
          return -1;
        }
        sVar3 = strlen((char *)value_local);
        sStack_40 = json_object_get_cell_ix
                              ((JSON_Object *)pcVar1,(char *)pJVar4,sVar3,uStack_30,
                               (parson_bool_t *)((long)&cell_ix + 4));
      }
      *(JSON_Value **)(*(long *)(name_local + 0x18) + *(long *)(name_local + 0x30) * 8) =
           value_local;
      *(undefined8 *)(*(long *)(name_local + 8) + sStack_40 * 8) =
           *(undefined8 *)(name_local + 0x30);
      *(unsigned_long *)(*(long *)(name_local + 0x20) + *(long *)(name_local + 0x30) * 8) = hash;
      *(size_t *)(*(long *)(name_local + 0x28) + *(long *)(name_local + 0x30) * 8) = sStack_40;
      *(unsigned_long *)(*(long *)(name_local + 0x10) + *(long *)(name_local + 0x30) * 8) =
           uStack_30;
      *(long *)(name_local + 0x30) = *(long *)(name_local + 0x30) + 1;
      pJVar4 = json_object_get_wrapping_value((JSON_Object *)name_local);
      *(JSON_Value **)hash = pJVar4;
      object_local._4_4_ = 0;
    }
    else {
      object_local._4_4_ = -1;
    }
  }
  return object_local._4_4_;
}

Assistant:

static JSON_Status json_object_add(JSON_Object *object, char *name, JSON_Value *value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    JSON_Status res = JSONFailure;

    if (!object || !name || !value) {
        return JSONFailure;
    }

    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (found) {
        return JSONFailure;
    }

    if (object->count >= object->item_capacity) {
        res = json_object_grow_and_rehash(object);
        if (res != JSONSuccess) {
            return JSONFailure;
        }
        cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    }

    object->names[object->count] = name;
    object->cells[cell_ix] = object->count;
    object->values[object->count] = value;
    object->cell_ixs[object->count] = cell_ix;
    object->hashes[object->count] = hash;
    object->count++;
    value->parent = json_object_get_wrapping_value(object);

    return JSONSuccess;
}